

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

void AddNonCompressedBlock
               (ZopfliOptions *options,int final,uchar *in,size_t instart,size_t inend,uchar *bp,
               uchar **out,size_t *outsize)

{
  uchar *puVar1;
  uchar *puVar2;
  void *pvVar3;
  uint uVar4;
  uint uVar6;
  undefined4 in_register_00000034;
  uchar *puVar7;
  ulong uVar8;
  ulong uVar5;
  
  do {
    uVar6 = (int)instart - (int)in;
    if (in + 0xffff <= instart) {
      uVar6 = 0xffff;
    }
    uVar4 = uVar6 & 0xffff;
    uVar5 = (ulong)uVar4;
    puVar1 = in + uVar5;
    AddBit((uint)(instart <= puVar1 && (int)options != 0),(uchar *)inend,(uchar **)bp,(size_t *)out)
    ;
    AddBit(0,(uchar *)inend,(uchar **)bp,(size_t *)out);
    AddBit(0,(uchar *)inend,(uchar **)bp,(size_t *)out);
    *(undefined1 *)inend = 0;
    puVar7 = *out;
    if (((ulong)puVar7 & (ulong)(puVar7 + -1)) == 0) {
      if (puVar7 == (uchar *)0x0) {
        pvVar3 = malloc(1);
        puVar7 = (uchar *)0x0;
      }
      else {
        pvVar3 = realloc(*(void **)bp,(long)puVar7 * 2);
        puVar7 = *out;
      }
      *(void **)bp = pvVar3;
    }
    else {
      pvVar3 = *(void **)bp;
    }
    *(uchar *)((long)pvVar3 + (long)puVar7) = (uchar)uVar4;
    puVar2 = *out;
    puVar7 = puVar2 + 1;
    *out = puVar7;
    if (((ulong)puVar7 & (ulong)puVar2) == 0) {
      if (puVar7 == (uchar *)0x0) {
        pvVar3 = malloc(1);
        puVar7 = (uchar *)0x0;
      }
      else {
        pvVar3 = realloc(*(void **)bp,(long)puVar7 * 2);
        puVar7 = *out;
      }
      *(void **)bp = pvVar3;
    }
    else {
      pvVar3 = *(void **)bp;
    }
    *(uchar *)((long)pvVar3 + (long)puVar7) = (uchar)(uVar4 >> 8);
    puVar2 = *out;
    puVar7 = puVar2 + 1;
    *out = puVar7;
    if (((ulong)puVar7 & (ulong)puVar2) == 0) {
      if (puVar7 == (uchar *)0x0) {
        pvVar3 = malloc(1);
        puVar7 = (uchar *)0x0;
      }
      else {
        pvVar3 = realloc(*(void **)bp,(long)puVar7 * 2);
        puVar7 = *out;
      }
      *(void **)bp = pvVar3;
    }
    else {
      pvVar3 = *(void **)bp;
    }
    *(uchar *)((long)pvVar3 + (long)puVar7) = (uchar)~uVar6;
    puVar2 = *out;
    puVar7 = puVar2 + 1;
    *out = puVar7;
    if (((ulong)puVar7 & (ulong)puVar2) == 0) {
      if (puVar7 == (uchar *)0x0) {
        pvVar3 = malloc(1);
        puVar7 = (uchar *)0x0;
      }
      else {
        pvVar3 = realloc(*(void **)bp,(long)puVar7 * 2);
        puVar7 = *out;
      }
      *(void **)bp = pvVar3;
    }
    else {
      pvVar3 = *(void **)bp;
    }
    *(uchar *)((long)pvVar3 + (long)puVar7) = (uchar)(~uVar6 >> 8);
    puVar7 = *out + 1;
    *out = puVar7;
    if (uVar5 != 0) {
      uVar8 = 0;
      do {
        if (((ulong)puVar7 & (ulong)(puVar7 + -1)) == 0) {
          if (puVar7 == (uchar *)0x0) {
            pvVar3 = malloc(1);
            puVar7 = (uchar *)0x0;
          }
          else {
            pvVar3 = realloc(*(void **)bp,(long)puVar7 * 2);
            puVar7 = *out;
          }
          *(void **)bp = pvVar3;
        }
        else {
          pvVar3 = *(void **)bp;
        }
        *(uchar *)((long)pvVar3 + (long)puVar7) = in[uVar8 + CONCAT44(in_register_00000034,final)];
        puVar7 = *out + 1;
        *out = puVar7;
        uVar8 = uVar8 + 1;
      } while (uVar5 != uVar8);
    }
    in = puVar1;
  } while (puVar1 < instart);
  return;
}

Assistant:

static void AddNonCompressedBlock(const ZopfliOptions* options, int final,
                                  const unsigned char* in, size_t instart,
                                  size_t inend,
                                  unsigned char* bp,
                                  unsigned char** out, size_t* outsize) {
  size_t pos = instart;
  (void)options;
  for (;;) {
    size_t i;
    unsigned short blocksize = 65535;
    unsigned short nlen;
    int currentfinal;

    if (pos + blocksize > inend) blocksize = inend - pos;
    currentfinal = pos + blocksize >= inend;

    nlen = ~blocksize;

    AddBit(final && currentfinal, bp, out, outsize);
    /* BTYPE 00 */
    AddBit(0, bp, out, outsize);
    AddBit(0, bp, out, outsize);

    /* Any bits of input up to the next byte boundary are ignored. */
    *bp = 0;

    ZOPFLI_APPEND_DATA(blocksize % 256, out, outsize);
    ZOPFLI_APPEND_DATA((blocksize / 256) % 256, out, outsize);
    ZOPFLI_APPEND_DATA(nlen % 256, out, outsize);
    ZOPFLI_APPEND_DATA((nlen / 256) % 256, out, outsize);

    for (i = 0; i < blocksize; i++) {
      ZOPFLI_APPEND_DATA(in[pos + i], out, outsize);
    }

    if (currentfinal) break;
    pos += blocksize;
  }
}